

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry> *
__thiscall
kj::ArrayBuilder<const_void_*>::operator=
          (ArrayBuilder<const_void_*> *this,
          ArrayBuilder<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry>
          *other)

{
  ArrayBuilder<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry>
  *other_local;
  ArrayBuilder<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry>
  *this_local;
  
  dispose(this);
  *(Entry **)this = other->ptr;
  *(RemoveConst<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry> **)
   (this + 8) = other->pos;
  *(Entry **)(this + 0x10) = other->endPtr;
  *(ArrayDisposer **)(this + 0x18) = other->disposer;
  other->ptr = (Entry *)0x0;
  other->pos = (RemoveConst<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry>
                *)0x0;
  other->endPtr = (Entry *)0x0;
  return (ArrayBuilder<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry>
          *)this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }